

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileNumLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pVal;
  jx9_vm *pjVar1;
  jx9_value *pjVar2;
  sxi64 sVar3;
  sxu32 nIdx;
  sxu32 local_20;
  sxu32 local_1c;
  
  pVal = pGen->pIn;
  local_20 = 0;
  if ((pVal->nType & 1) == 0) {
    pjVar2 = jx9VmReserveConstObj(pGen->pVm,&local_20);
    if (pjVar2 == (jx9_value *)0x0) {
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
      return -10;
    }
    jx9MemObjInitFromString(pGen->pVm,pjVar2,&pVal->sData);
    jx9MemObjToReal(pjVar2);
  }
  else {
    sVar3 = jx9TokenValueToInt64(&pVal->sData);
    local_1c = 0;
    pjVar2 = jx9VmReserveConstObj(pGen->pVm,&local_1c);
    if (pjVar2 == (jx9_value *)0x0) {
      pjVar2 = (jx9_value *)0x0;
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
    }
    else {
      local_20 = local_1c;
    }
    if (pjVar2 == (jx9_value *)0x0) {
      return -10;
    }
    pjVar1 = pGen->pVm;
    pjVar2->pVm = (jx9_vm *)0x0;
    (pjVar2->sBlob).pAllocator = (SyMemBackend *)0x0;
    *(undefined8 *)&(pjVar2->sBlob).nFlags = 0;
    *(undefined8 *)&pjVar2->nIdx = 0;
    (pjVar2->x).rVal = 0.0;
    *(undefined8 *)&pjVar2->iFlags = 0;
    (pjVar2->sBlob).pBlob = (void *)0x0;
    (pjVar2->sBlob).nByte = 0;
    (pjVar2->sBlob).mByte = 0;
    pjVar2->pVm = pjVar1;
    (pjVar2->sBlob).pAllocator = &pjVar1->sAllocator;
    (pjVar2->sBlob).nFlags = 0;
    (pjVar2->x).iVal = sVar3;
    pjVar2->iFlags = 2;
  }
  jx9VmEmitInstr(pGen->pVm,4,0,local_20,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

static sxi32 jx9CompileNumLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn; /* Raw token */
	sxu32 nIdx = 0;
	if( pToken->nType & JX9_TK_INTEGER ){
		jx9_value *pObj;
		sxi64 iValue;
		iValue = jx9TokenValueToInt64(&pToken->sData);
		pObj = GenStateInstallNumLiteral(&(*pGen), &nIdx);
		if( pObj == 0 ){
			SXUNUSED(iCompileFlag); /* cc warning */
			return SXERR_ABORT;
		}
		jx9MemObjInitFromInt(pGen->pVm, pObj, iValue);
	}else{
		/* Real number */
		jx9_value *pObj;
		/* Reserve a new constant */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		jx9MemObjToReal(pObj);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}